

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void rnn_prepdb(rnndb *db)

{
  rnnenum *prVar1;
  rnnbitset *prVar2;
  rnndomain *prVar3;
  rnnspectype *prVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  for (lVar7 = 0; lVar7 < db->enumsnum; lVar7 = lVar7 + 1) {
    prVar1 = db->enums[lVar7];
    if (prVar1->prepared == 0) {
      prepvarinfo(db,prVar1->name,&prVar1->varinfo,(rnnvarinfo *)0x0);
      if (prVar1->isinline == 0) {
        for (lVar6 = 0; lVar6 < prVar1->valsnum; lVar6 = lVar6 + 1) {
          if (prVar1->bare == 0) {
            pcVar5 = prVar1->name;
          }
          else {
            pcVar5 = (char *)0x0;
          }
          prepvalue(db,prVar1->vals[lVar6],pcVar5,&prVar1->varinfo);
        }
        pcVar5 = catstr((prVar1->varinfo).prefix,prVar1->name);
        prVar1->fullname = pcVar5;
        prVar1->prepared = 1;
      }
    }
  }
  for (lVar7 = 0; lVar7 < db->bitsetsnum; lVar7 = lVar7 + 1) {
    prVar2 = db->bitsets[lVar7];
    prepvarinfo(db,prVar2->name,&prVar2->varinfo,(rnnvarinfo *)0x0);
    if (prVar2->isinline == 0) {
      for (lVar6 = 0; lVar6 < prVar2->bitfieldsnum; lVar6 = lVar6 + 1) {
        if (prVar2->bare == 0) {
          pcVar5 = prVar2->name;
        }
        else {
          pcVar5 = (char *)0x0;
        }
        prepbitfield(db,prVar2->bitfields[lVar6],pcVar5,&prVar2->varinfo);
      }
      pcVar5 = catstr((prVar2->varinfo).prefix,prVar2->name);
      prVar2->fullname = pcVar5;
    }
  }
  for (lVar7 = 0; lVar7 < db->domainsnum; lVar7 = lVar7 + 1) {
    prVar3 = db->domains[lVar7];
    prepvarinfo(db,prVar3->name,&prVar3->varinfo,(rnnvarinfo *)0x0);
    for (lVar6 = 0; lVar6 < prVar3->subelemsnum; lVar6 = lVar6 + 1) {
      if (prVar3->bare == 0) {
        pcVar5 = prVar3->name;
      }
      else {
        pcVar5 = (char *)0x0;
      }
      prepdelem(db,prVar3->subelems[lVar6],pcVar5,&prVar3->varinfo,prVar3->width);
    }
    pcVar5 = catstr((prVar3->varinfo).prefix,prVar3->name);
    prVar3->fullname = pcVar5;
  }
  for (lVar7 = 0; lVar7 < db->spectypesnum; lVar7 = lVar7 + 1) {
    prVar4 = db->spectypes[lVar7];
    preptypeinfo(db,&prVar4->typeinfo,prVar4->name,(rnnvarinfo *)0x0,0x20,prVar4->file);
  }
  return;
}

Assistant:

void rnn_prepdb (struct rnndb *db) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		prepenum(db, db->enums[i]);
	for (i = 0; i < db->bitsetsnum; i++)
		prepbitset(db, db->bitsets[i]);
	for (i = 0; i < db->domainsnum; i++)
		prepdomain(db, db->domains[i]);
	for (i = 0; i < db->spectypesnum; i++)
		prepspectype(db, db->spectypes[i]);
}